

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O3

void emitter_dict_begin(emitter_t *emitter,char *json_key,char *table_header)

{
  emitter_output_t eVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  eVar1 = emitter->output;
  if (emitter_output_json_compact < eVar1) {
    if (eVar1 != emitter_output_table) {
      return;
    }
    if (0 < emitter->nesting_depth) {
      iVar4 = emitter->nesting_depth * 2;
      do {
        emitter_printf(emitter,"%s"," ");
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    emitter_printf(emitter,"%s\n",table_header);
    goto LAB_011808af;
  }
  if (emitter->emitted_key == true) {
    emitter->emitted_key = false;
LAB_01180868:
    if (eVar1 == emitter_output_json_compact) goto LAB_0118086d;
    pcVar2 = " ";
  }
  else {
    if (emitter->item_at_depth == true) {
      emitter_printf(emitter,",");
      eVar1 = emitter->output;
    }
    if (eVar1 != emitter_output_json_compact) {
      emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
      eVar1 = emitter->output;
      pcVar2 = anon_var_dwarf_63f1aec + 7;
      if (eVar1 != emitter_output_json) {
        pcVar2 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar3 = emitter->nesting_depth << (eVar1 != emitter_output_json);
        iVar4 = 1;
        if (1 < iVar3) {
          iVar4 = iVar3;
        }
        do {
          emitter_printf(emitter,"%s",pcVar2);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        eVar1 = emitter->output;
      }
      goto LAB_01180868;
    }
LAB_0118086d:
    pcVar2 = anon_var_dwarf_63f17de + 9;
  }
  emitter_printf(emitter,"\"%s\":%s",json_key,pcVar2);
  emitter->emitted_key = true;
  if (emitter_output_json_compact < emitter->output) {
    return;
  }
  emitter->emitted_key = false;
  emitter_printf(emitter,"{");
LAB_011808af:
  emitter->nesting_depth = emitter->nesting_depth + 1;
  emitter->item_at_depth = false;
  return;
}

Assistant:

static inline void
emitter_dict_begin(emitter_t *emitter, const char *json_key,
    const char *table_header) {
	if (emitter_outputs_json(emitter)) {
		emitter_json_key(emitter, json_key);
		emitter_json_object_begin(emitter);
	} else {
		emitter_table_dict_begin(emitter, table_header);
	}
}